

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cc
# Opt level: O0

void __thiscall muduo::ThreadPool::run(ThreadPool *this,Task *task)

{
  bool bVar1;
  pointer *__stat_loc;
  vector<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>,_std::allocator<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>_>_>
  *in_RDI;
  MutexLockGuard lock;
  MutexLock *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  
  bVar1 = std::
          vector<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>,_std::allocator<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>_>_>
          ::empty(in_RDI);
  if (bVar1) {
    std::function<void_()>::operator()
              ((function<void_()> *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  }
  else {
    __stat_loc = &(in_RDI->
                  super__Vector_base<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>,_std::allocator<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
    MutexLockGuard::MutexLockGuard
              ((MutexLockGuard *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8);
    while( true ) {
      in_stack_ffffffffffffffc7 =
           isFull((ThreadPool *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
      if (!(bool)in_stack_ffffffffffffffc7) break;
      Condition::wait((Condition *)
                      &in_RDI[4].
                       super__Vector_base<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>,_std::allocator<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,__stat_loc);
    }
    std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::push_back
              ((deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)
               CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
               (value_type *)in_stack_ffffffffffffffb8);
    Condition::notify((Condition *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
    MutexLockGuard::~MutexLockGuard((MutexLockGuard *)0x1515d9);
  }
  return;
}

Assistant:

void ThreadPool::run(Task task)
{
  if (threads_.empty())
  {
    task();
  }
  else
  {
    MutexLockGuard lock(mutex_);
    while (isFull())
    {
      notFull_.wait();
    }
    assert(!isFull());

    queue_.push_back(std::move(task));
    notEmpty_.notify();
  }
}